

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman.c
# Opt level: O3

void BZ2_hbMakeCodeLengths(UChar *len,Int32 *freq,Int32 alphaSize,Int32 maxLen)

{
  bool bVar1;
  Int32 tmp;
  ulong uVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  uint local_1468 [260];
  uint local_1058 [516];
  undefined4 local_848;
  uint local_844 [517];
  
  uVar5 = (ulong)(uint)alphaSize;
  if (0 < alphaSize) {
    uVar2 = 0;
    do {
      uVar14 = freq[uVar2] << 8;
      if (freq[uVar2] == 0) {
        uVar14 = 0x100;
      }
      local_1058[uVar2 + 1] = uVar14;
      uVar2 = uVar2 + 1;
    } while (uVar5 != uVar2);
  }
  if (alphaSize < 1) {
    return;
  }
  do {
    local_848 = 0xfffffffe;
    local_1058[0] = 0;
    local_1468[0] = 0;
    memset(local_844,0xff,uVar5 * 4);
    lVar3 = 1;
    uVar2 = 0;
    do {
      local_1468[uVar2 + 1] = (uint)lVar3;
      uVar2 = uVar2 + 1;
      uVar14 = local_1058[lVar3];
      uVar6 = uVar2 >> 1 & 0x7fffffff;
      lVar9 = (long)(int)local_1468[uVar6];
      if ((int)uVar14 < (int)local_1058[lVar9]) {
        uVar13 = uVar2 & 0xffffffff;
        do {
          uVar7 = uVar6;
          local_1468[uVar13] = (uint)lVar9;
          lVar9 = (long)(int)local_1468[uVar7 >> 1];
          uVar6 = uVar7 >> 1;
          uVar13 = uVar7;
        } while ((int)uVar14 < (int)local_1058[lVar9]);
      }
      else {
        uVar7 = uVar2 & 0xffffffff;
      }
      local_1468[uVar7] = (uint)lVar3;
      lVar3 = lVar3 + 1;
    } while (uVar2 != uVar5);
    if (0x103 < (uint)alphaSize) {
      BZ2_bz__AssertH__fail(0x7d1);
    }
    uVar2 = uVar5;
    lVar3 = (long)alphaSize;
    if (1 < alphaSize) {
      do {
        lVar9 = lVar3;
        lVar3 = (long)(int)local_1468[1];
        uVar14 = local_1468[uVar2];
        local_1468[1] = uVar14;
        uVar6 = uVar2 - 1;
        if (uVar2 < 3) {
          uVar10 = local_1468[uVar6];
          local_1468[1] = uVar10;
          lVar17 = 1;
        }
        else {
          uVar10 = local_1058[(int)uVar14];
          uVar15 = 2;
          uVar11 = 1;
          do {
            lVar17 = (long)(int)uVar15;
            uVar8 = uVar15;
            if (lVar17 < (long)uVar6) {
              uVar8 = uVar15 | 1;
              if ((int)local_1058[(int)local_1468[lVar17]] <=
                  (int)local_1058[(int)local_1468[(int)(uVar15 | 1)]]) {
                uVar8 = uVar15;
              }
              lVar17 = (long)(int)uVar8;
            }
            if ((int)uVar10 < (int)local_1058[(int)local_1468[lVar17]]) break;
            local_1468[(int)uVar11] = local_1468[lVar17];
            uVar15 = uVar8 * 2;
            uVar11 = uVar8;
          } while ((long)(int)uVar15 < (long)uVar2);
          local_1468[(int)uVar11] = uVar14;
          uVar14 = local_1468[1];
          uVar10 = local_1468[uVar6];
          local_1468[1] = uVar10;
          lVar17 = 1;
          if (3 < (long)uVar2) {
            uVar15 = local_1058[(int)uVar10];
            uVar11 = 2;
            uVar8 = 1;
            do {
              lVar17 = (long)(int)uVar11;
              uVar4 = uVar11;
              if (lVar17 < (long)(uVar2 - 2)) {
                uVar4 = uVar11 | 1;
                if ((int)local_1058[(int)local_1468[lVar17]] <=
                    (int)local_1058[(int)local_1468[(int)(uVar11 | 1)]]) {
                  uVar4 = uVar11;
                }
                lVar17 = (long)(int)uVar4;
              }
              if ((int)uVar15 < (int)local_1058[(int)local_1468[lVar17]]) break;
              local_1468[(int)uVar8] = local_1468[lVar17];
              uVar11 = uVar4 * 2;
              uVar8 = uVar4;
            } while ((long)(int)uVar11 <= (long)(uVar2 - 2));
            lVar17 = (long)(int)uVar8;
          }
        }
        local_1468[lVar17] = uVar10;
        uVar10 = local_1058[lVar3];
        uVar15 = local_1058[(int)uVar14];
        uVar8 = uVar10 & 0xff;
        uVar11 = uVar15 & 0xff;
        if (uVar11 < uVar8) {
          uVar11 = uVar8;
        }
        uVar8 = (uint)(lVar9 + 1);
        local_844[(long)(int)uVar14 + -1] = uVar8;
        local_844[lVar3 + -1] = uVar8;
        uVar14 = uVar11 + 1 | (uVar15 & 0xffffff00) + (uVar10 & 0xffffff00);
        local_1058[lVar9 + 1] = uVar14;
        local_844[lVar9] = 0xffffffff;
        local_1468[uVar6] = uVar8;
        uVar7 = uVar6 >> 1 & 0x7fffffff;
        lVar3 = (long)(int)local_1468[uVar7];
        if ((int)uVar14 < (int)local_1058[lVar3]) {
          uVar16 = uVar6 & 0xffffffff;
          do {
            uVar13 = uVar7;
            local_1468[uVar16] = (uint)lVar3;
            lVar3 = (long)(int)local_1468[uVar13 >> 1];
            uVar7 = uVar13 >> 1;
            uVar16 = uVar13;
          } while ((int)uVar14 < (int)local_1058[lVar3]);
        }
        else {
          uVar13 = uVar6 & 0xffffffff;
        }
        local_1468[uVar13] = uVar8;
        bVar1 = 2 < uVar2;
        uVar2 = uVar6;
        lVar3 = lVar9 + 1;
      } while (bVar1);
      if (0x202 < lVar9) {
        BZ2_bz__AssertH__fail(0x7d2);
      }
    }
    if (alphaSize < 1) {
      return;
    }
    uVar2 = 1;
    bVar1 = false;
    do {
      iVar12 = -1;
      uVar6 = uVar2 & 0xffffffff;
      do {
        lVar3 = uVar6 - 1;
        uVar6 = (ulong)local_844[lVar3];
        iVar12 = iVar12 + 1;
      } while (-1 < (int)local_844[lVar3]);
      len[uVar2 - 1] = (UChar)iVar12;
      if (maxLen < iVar12) {
        bVar1 = true;
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 != alphaSize + 1);
    if (!bVar1) {
      return;
    }
    if (alphaSize < 1) {
      return;
    }
    uVar2 = 1;
    do {
      local_1058[uVar2] =
           (((int)local_1058[uVar2] >> 8) - ((int)local_1058[uVar2] >> 0x1f) & 0xfffffffeU) * 0x80 +
           0x100;
      uVar2 = uVar2 + 1;
    } while (alphaSize + 1 != uVar2);
    if (alphaSize < 1) {
      return;
    }
  } while( true );
}

Assistant:

void BZ2_hbMakeCodeLengths ( UChar *len, 
                             Int32 *freq,
                             Int32 alphaSize,
                             Int32 maxLen )
{
   /*--
      Nodes and heap entries run from 1.  Entry 0
      for both the heap and nodes is a sentinel.
   --*/
   Int32 nNodes, nHeap, n1, n2, i, j, k;
   Bool  tooLong;

   Int32 heap   [ BZ_MAX_ALPHA_SIZE + 2 ];
   Int32 weight [ BZ_MAX_ALPHA_SIZE * 2 ];
   Int32 parent [ BZ_MAX_ALPHA_SIZE * 2 ]; 

   for (i = 0; i < alphaSize; i++)
      weight[i+1] = (freq[i] == 0 ? 1 : freq[i]) << 8;

   while (True) {

      nNodes = alphaSize;
      nHeap = 0;

      heap[0] = 0;
      weight[0] = 0;
      parent[0] = -2;

      for (i = 1; i <= alphaSize; i++) {
         parent[i] = -1;
         nHeap++;
         heap[nHeap] = i;
         UPHEAP(nHeap);
      }

      AssertH( nHeap < (BZ_MAX_ALPHA_SIZE+2), 2001 );
   
      while (nHeap > 1) {
         n1 = heap[1]; heap[1] = heap[nHeap]; nHeap--; DOWNHEAP(1);
         n2 = heap[1]; heap[1] = heap[nHeap]; nHeap--; DOWNHEAP(1);
         nNodes++;
         parent[n1] = parent[n2] = nNodes;
         weight[nNodes] = ADDWEIGHTS(weight[n1], weight[n2]);
         parent[nNodes] = -1;
         nHeap++;
         heap[nHeap] = nNodes;
         UPHEAP(nHeap);
      }

      AssertH( nNodes < (BZ_MAX_ALPHA_SIZE * 2), 2002 );

      tooLong = False;
      for (i = 1; i <= alphaSize; i++) {
         j = 0;
         k = i;
         while (parent[k] >= 0) { k = parent[k]; j++; }
         len[i-1] = j;
         if (j > maxLen) tooLong = True;
      }
      
      if (! tooLong) break;

      /* 17 Oct 04: keep-going condition for the following loop used
         to be 'i < alphaSize', which missed the last element,
         theoretically leading to the possibility of the compressor
         looping.  However, this count-scaling step is only needed if
         one of the generated Huffman code words is longer than
         maxLen, which up to and including version 1.0.2 was 20 bits,
         which is extremely unlikely.  In version 1.0.3 maxLen was
         changed to 17 bits, which has minimal effect on compression
         ratio, but does mean this scaling step is used from time to
         time, enough to verify that it works.

         This means that bzip2-1.0.3 and later will only produce
         Huffman codes with a maximum length of 17 bits.  However, in
         order to preserve backwards compatibility with bitstreams
         produced by versions pre-1.0.3, the decompressor must still
         handle lengths of up to 20. */

      for (i = 1; i <= alphaSize; i++) {
         j = weight[i] >> 8;
         j = 1 + (j / 2);
         weight[i] = j << 8;
      }
   }
}